

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O3

VP8StatusCode
ParseHeadersInternal
          (uint8_t *data,size_t data_size,int *width,int *height,int *has_alpha,int *has_animation,
          int *format,WebPHeaderStructure *headers)

{
  bool bVar1;
  int *piVar2;
  VP8StatusCode VVar3;
  int iVar4;
  size_t riff_size;
  long lVar5;
  uint uVar6;
  uint8_t **ppuVar7;
  WebPHeaderStructure *pWVar8;
  bool bVar9;
  byte bVar10;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  int *local_88;
  ulong local_80;
  uint8_t *local_78;
  size_t local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  uint8_t *local_58;
  size_t sStack_50;
  size_t local_48;
  size_t sStack_40;
  int local_38 [2];
  
  bVar10 = 0;
  if (headers == (WebPHeaderStructure *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar4 = headers->have_all_data;
  }
  if (data_size < 0xc || data == (uint8_t *)0x0) {
    return VP8_STATUS_NOT_ENOUGH_DATA;
  }
  local_48 = 0;
  sStack_40 = 0;
  local_58 = (uint8_t *)0x0;
  sStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_38[0] = 0;
  local_38[1] = 0;
  bVar9 = *(int *)data != 0x46464952;
  local_88 = (int *)data;
  local_80 = data_size;
  if (!bVar9) {
    if (*(int *)(data + 8) != 0x50424557) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    if (*(uint *)(data + 4) + 9 < 0x15) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    sStack_40 = (size_t)*(uint *)(data + 4);
    if ((iVar4 != 0) && (data_size - 8 < sStack_40)) {
      return VP8_STATUS_NOT_ENOUGH_DATA;
    }
    local_88 = (int *)(data + 0xc);
    local_80 = data_size - 0xc;
    if (local_80 < 8) {
      return VP8_STATUS_NOT_ENOUGH_DATA;
    }
  }
  bVar1 = *local_88 != 0x58385056;
  if (*local_88 == 0x58385056) {
    if (local_88[1] != 10) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    if (local_80 < 0x12) {
      return VP8_STATUS_NOT_ENOUGH_DATA;
    }
    local_98 = (uint)*(byte *)((long)local_88 + 0xe) * 0x10000 + (uint)*(ushort *)(local_88 + 3) + 1
    ;
    local_8c = (uint)*(byte *)((long)local_88 + 0x11) * 0x10000 +
               (uint)*(ushort *)((long)local_88 + 0xf) + 1;
    if ((int)((ulong)local_98 * (ulong)local_8c >> 0x20) != 0) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    uVar6 = local_88[2];
    local_88 = (int *)((long)local_88 + 0x12);
    local_80 = local_80 - 0x12;
    if (bVar9) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    local_90 = (uVar6 & 2) >> 1;
  }
  else {
    local_90 = 0;
    uVar6 = 0;
    local_8c = 0;
    local_98 = 0;
  }
  if (has_alpha != (int *)0x0) {
    *has_alpha = uVar6 >> 4 & 1;
  }
  if (has_animation != (int *)0x0) {
    *has_animation = local_90;
  }
  if (format != (int *)0x0) {
    *format = 0;
  }
  local_9c = local_8c;
  if ((headers == (WebPHeaderStructure *)0x0 & (byte)local_90) != 0) goto LAB_001102f7;
  VVar3 = VP8_STATUS_NOT_ENOUGH_DATA;
  if (3 < local_80) {
    local_94 = local_98;
    local_78 = data;
    local_70 = data_size;
    if (bVar9 || bVar1) {
      riff_size = sStack_40;
      if ((bVar9) && (bVar1)) {
        if (*local_88 == 0x48504c41) goto LAB_00110291;
        riff_size = 0;
      }
    }
    else {
LAB_00110291:
      VVar3 = ParseOptionalChunks((uint8_t **)&local_88,&local_80,sStack_40,&local_58,&sStack_50);
      riff_size = sStack_40;
      if (VVar3 != VP8_STATUS_OK) goto LAB_001102e1;
    }
    VVar3 = ParseVP8Header((uint8_t **)&local_88,&local_80,iVar4,riff_size,&local_48,local_38);
    piVar2 = local_88;
    if (VVar3 == VP8_STATUS_OK) {
      if (0xfffffff6 < local_48) {
        return VP8_STATUS_BITSTREAM_ERROR;
      }
      if ((format != (int *)0x0) && (local_90 == 0)) {
        *format = 2 - (uint)(local_38[0] == 0);
      }
      VVar3 = VP8_STATUS_NOT_ENOUGH_DATA;
      if (local_38[0] == 0) {
        if (9 < local_80) {
          iVar4 = VP8GetInfo((uint8_t *)local_88,local_80,local_48,(int *)&local_98,(int *)&local_9c
                            );
          goto LAB_00110411;
        }
      }
      else if (4 < local_80) {
        iVar4 = VP8LGetInfo((uint8_t *)local_88,local_80,(int *)&local_98,(int *)&local_9c,has_alpha
                           );
LAB_00110411:
        if (iVar4 == 0) {
          return VP8_STATUS_BITSTREAM_ERROR;
        }
        if (!bVar1) {
          if (local_94 != local_98) {
            return VP8_STATUS_BITSTREAM_ERROR;
          }
          if (local_8c != local_9c) {
            return VP8_STATUS_BITSTREAM_ERROR;
          }
        }
        if (headers != (WebPHeaderStructure *)0x0) {
          ppuVar7 = &local_78;
          pWVar8 = headers;
          for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
            pWVar8->data = *ppuVar7;
            ppuVar7 = ppuVar7 + (ulong)bVar10 * -2 + 1;
            pWVar8 = (WebPHeaderStructure *)((long)pWVar8 + (ulong)bVar10 * -0x10 + 8);
          }
          headers->offset = (long)piVar2 - (long)headers->data;
        }
        goto LAB_001102f7;
      }
    }
  }
LAB_001102e1:
  if (headers != (WebPHeaderStructure *)0x0) {
    return VVar3;
  }
  if (bVar1) {
    return VVar3;
  }
  if (VVar3 != VP8_STATUS_NOT_ENOUGH_DATA) {
    return VVar3;
  }
LAB_001102f7:
  if (has_alpha != (int *)0x0) {
    *has_alpha = *has_alpha | (uint)(local_58 != (uint8_t *)0x0);
  }
  if (width != (int *)0x0) {
    *width = local_98;
  }
  if (height != (int *)0x0) {
    *height = local_9c;
    return VP8_STATUS_OK;
  }
  return VP8_STATUS_OK;
}

Assistant:

static VP8StatusCode ParseHeadersInternal(const uint8_t* data,
                                          size_t data_size,
                                          int* const width,
                                          int* const height,
                                          int* const has_alpha,
                                          int* const has_animation,
                                          int* const format,
                                          WebPHeaderStructure* const headers) {
  int canvas_width = 0;
  int canvas_height = 0;
  int image_width = 0;
  int image_height = 0;
  int found_riff = 0;
  int found_vp8x = 0;
  int animation_present = 0;
  const int have_all_data = (headers != NULL) ? headers->have_all_data : 0;

  VP8StatusCode status;
  WebPHeaderStructure hdrs;

  if (data == NULL || data_size < RIFF_HEADER_SIZE) {
    return VP8_STATUS_NOT_ENOUGH_DATA;
  }
  memset(&hdrs, 0, sizeof(hdrs));
  hdrs.data = data;
  hdrs.data_size = data_size;

  // Skip over RIFF header.
  status = ParseRIFF(&data, &data_size, have_all_data, &hdrs.riff_size);
  if (status != VP8_STATUS_OK) {
    return status;   // Wrong RIFF header / insufficient data.
  }
  found_riff = (hdrs.riff_size > 0);

  // Skip over VP8X.
  {
    uint32_t flags = 0;
    status = ParseVP8X(&data, &data_size, &found_vp8x,
                       &canvas_width, &canvas_height, &flags);
    if (status != VP8_STATUS_OK) {
      return status;  // Wrong VP8X / insufficient data.
    }
    animation_present = !!(flags & ANIMATION_FLAG);
    if (!found_riff && found_vp8x) {
      // Note: This restriction may be removed in the future, if it becomes
      // necessary to send VP8X chunk to the decoder.
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    if (has_alpha != NULL) *has_alpha = !!(flags & ALPHA_FLAG);
    if (has_animation != NULL) *has_animation = animation_present;
    if (format != NULL) *format = 0;   // default = undefined

    image_width = canvas_width;
    image_height = canvas_height;
    if (found_vp8x && animation_present && headers == NULL) {
      status = VP8_STATUS_OK;
      goto ReturnWidthHeight;  // Just return features from VP8X header.
    }
  }

  if (data_size < TAG_SIZE) {
    status = VP8_STATUS_NOT_ENOUGH_DATA;
    goto ReturnWidthHeight;
  }

  // Skip over optional chunks if data started with "RIFF + VP8X" or "ALPH".
  if ((found_riff && found_vp8x) ||
      (!found_riff && !found_vp8x && !memcmp(data, "ALPH", TAG_SIZE))) {
    status = ParseOptionalChunks(&data, &data_size, hdrs.riff_size,
                                 &hdrs.alpha_data, &hdrs.alpha_data_size);
    if (status != VP8_STATUS_OK) {
      goto ReturnWidthHeight;  // Invalid chunk size / insufficient data.
    }
  }

  // Skip over VP8/VP8L header.
  status = ParseVP8Header(&data, &data_size, have_all_data, hdrs.riff_size,
                          &hdrs.compressed_size, &hdrs.is_lossless);
  if (status != VP8_STATUS_OK) {
    goto ReturnWidthHeight;  // Wrong VP8/VP8L chunk-header / insufficient data.
  }
  if (hdrs.compressed_size > MAX_CHUNK_PAYLOAD) {
    return VP8_STATUS_BITSTREAM_ERROR;
  }

  if (format != NULL && !animation_present) {
    *format = hdrs.is_lossless ? 2 : 1;
  }

  if (!hdrs.is_lossless) {
    if (data_size < VP8_FRAME_HEADER_SIZE) {
      status = VP8_STATUS_NOT_ENOUGH_DATA;
      goto ReturnWidthHeight;
    }
    // Validates raw VP8 data.
    if (!VP8GetInfo(data, data_size, (uint32_t)hdrs.compressed_size,
                    &image_width, &image_height)) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
  } else {
    if (data_size < VP8L_FRAME_HEADER_SIZE) {
      status = VP8_STATUS_NOT_ENOUGH_DATA;
      goto ReturnWidthHeight;
    }
    // Validates raw VP8L data.
    if (!VP8LGetInfo(data, data_size, &image_width, &image_height, has_alpha)) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
  }
  // Validates image size coherency.
  if (found_vp8x) {
    if (canvas_width != image_width || canvas_height != image_height) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
  }
  if (headers != NULL) {
    *headers = hdrs;
    headers->offset = data - headers->data;
    assert((uint64_t)(data - headers->data) < MAX_CHUNK_PAYLOAD);
    assert(headers->offset == headers->data_size - data_size);
  }
 ReturnWidthHeight:
  if (status == VP8_STATUS_OK ||
      (status == VP8_STATUS_NOT_ENOUGH_DATA && found_vp8x && headers == NULL)) {
    if (has_alpha != NULL) {
      // If the data did not contain a VP8X/VP8L chunk the only definitive way
      // to set this is by looking for alpha data (from an ALPH chunk).
      *has_alpha |= (hdrs.alpha_data != NULL);
    }
    if (width != NULL) *width = image_width;
    if (height != NULL) *height = image_height;
    return VP8_STATUS_OK;
  } else {
    return status;
  }
}